

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  UErrorCode UVar2;
  LocalPointerBase<UResourceBundle> LVar3;
  UBool UVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  UVector *pUVar8;
  ulong uVar9;
  UResourceBundle *pUVar10;
  UChar *pUVar11;
  char *cs;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  long lVar16;
  undefined8 *puVar17;
  ulong extraout_RAX;
  char cVar18;
  char *pcVar19;
  code *size;
  char cVar20;
  uint uVar21;
  UErrorCode sts;
  UErrorCode tmpSts;
  LocalUResourceBundlePointer typeAliasDataEntry;
  int32_t bcpTypeIdLen;
  int32_t bcpKeyIdLen;
  LocalUResourceBundlePointer typeMapEntry;
  LocalUResourceBundlePointer bcpTypeAliasResByKey;
  LocalUResourceBundlePointer typeAliasResByKey;
  LocalUResourceBundlePointer keyMapEntry;
  int32_t toLen;
  LocalUResourceBundlePointer keyTypeDataRes;
  LocalUResourceBundlePointer typeMapResByKey;
  LocalUResourceBundlePointer keyMapRes;
  LocalUResourceBundlePointer bcpTypeAliasRes;
  LocalUResourceBundlePointer typeAliasRes;
  LocalUResourceBundlePointer typeMapRes;
  UErrorCode local_c0;
  UErrorCode local_bc;
  LocalPointerBase<UResourceBundle> local_b8;
  uint local_b0;
  uint local_ac;
  LocalPointerBase<UResourceBundle> local_a8;
  LocalPointerBase<UResourceBundle> local_a0;
  LocalPointerBase<UResourceBundle> local_98;
  LocalPointerBase<UResourceBundle> local_90;
  int local_88;
  int32_t local_84;
  UHashtable *local_80;
  LocalPointerBase<UResourceBundle> local_78;
  uint local_6c;
  undefined8 *local_68;
  char *local_60;
  LocalPointerBase<UResourceBundle> local_58;
  LocalPointerBase<UResourceBundle> local_50;
  LocalPointerBase<UResourceBundle> local_48;
  LocalUResourceBundlePointer local_40;
  LocalPointerBase<UResourceBundle> local_38;
  
  local_c0 = U_ZERO_ERROR;
  if ((gLocExtKeyMapInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
     (UVar4 = icu_63::umtx_initImplPreInit(&gLocExtKeyMapInitOnce), UVar4 == '\0')) {
    uVar9 = (ulong)(uint)gLocExtKeyMapInitOnce.fErrCode;
    if (U_ZERO_ERROR < gLocExtKeyMapInitOnce.fErrCode) {
      local_c0 = gLocExtKeyMapInitOnce.fErrCode;
    }
  }
  else {
    ucln_common_registerCleanup_63(UCLN_COMMON_LOCALE_KEY_TYPE,uloc_key_type_cleanup);
    gLocExtKeyMap =
         uhash_open_63(uhash_hashIChars_63,uhash_compareIChars_63,(undefined1 *)0x0,&local_c0);
    local_78.ptr = ures_openDirect_63((char *)0x0,"keyTypeData",&local_c0);
    local_50.ptr = ures_getByKey_63(local_78.ptr,"keyMap",(UResourceBundle *)0x0,&local_c0);
    local_38.ptr = ures_getByKey_63(local_78.ptr,"typeMap",(UResourceBundle *)0x0,&local_c0);
    if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_bc = U_ZERO_ERROR;
      local_40.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)
           ures_getByKey_63(local_78.ptr,"typeAlias",(UResourceBundle *)0x0,&local_bc);
      local_bc = U_ZERO_ERROR;
      pcVar19 = "bcpTypeAlias";
      local_48.ptr = ures_getByKey_63(local_78.ptr,"bcpTypeAlias",(UResourceBundle *)0x0,&local_bc);
      pUVar8 = (UVector *)icu_63::UMemory::operator_new((UMemory *)0x28,(size_t)pcVar19);
      if (pUVar8 == (UVector *)0x0) {
        pUVar8 = (UVector *)0x0;
        size = (code *)pcVar19;
      }
      else {
        size = uloc_deleteKeyTypeStringPoolEntry;
        icu_63::UVector::UVector
                  (pUVar8,uloc_deleteKeyTypeStringPoolEntry,(UElementsAreEqual *)0x0,&local_c0);
      }
      if ((pUVar8 == (UVector *)0x0) && (local_c0 < U_ILLEGAL_ARGUMENT_ERROR)) {
        local_c0 = U_MEMORY_ALLOCATION_ERROR;
      }
      gKeyTypeStringPool = pUVar8;
      if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar8 = (UVector *)icu_63::UMemory::operator_new((UMemory *)0x28,(size_t)size);
        if (pUVar8 == (UVector *)0x0) {
          pUVar8 = (UVector *)0x0;
        }
        else {
          size = uloc_deleteKeyDataEntry;
          icu_63::UVector::UVector
                    (pUVar8,uloc_deleteKeyDataEntry,(UElementsAreEqual *)0x0,&local_c0);
        }
        if ((pUVar8 == (UVector *)0x0) && (local_c0 < U_ILLEGAL_ARGUMENT_ERROR)) {
          local_c0 = U_MEMORY_ALLOCATION_ERROR;
        }
        gLocExtKeyDataEntries = pUVar8;
        if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
          pUVar8 = (UVector *)icu_63::UMemory::operator_new((UMemory *)0x28,(size_t)size);
          if (pUVar8 == (UVector *)0x0) {
            pUVar8 = (UVector *)0x0;
          }
          else {
            icu_63::UVector::UVector(pUVar8,uloc_deleteTypeEntry,(UElementsAreEqual *)0x0,&local_c0)
            ;
          }
          if ((pUVar8 == (UVector *)0x0) && (local_c0 < U_ILLEGAL_ARGUMENT_ERROR)) {
            local_c0 = U_MEMORY_ALLOCATION_ERROR;
          }
          gLocExtTypeEntries = pUVar8;
          if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
            local_90.ptr = (UResourceBundle *)0x0;
            do {
              UVar4 = ures_hasNext_63(local_50.ptr);
              LVar3.ptr = local_90.ptr;
              if (UVar4 == '\0') break;
              local_90.ptr = (UResourceBundle *)0x0;
              pUVar10 = ures_getNextResource_63(local_50.ptr,LVar3.ptr,&local_c0);
              if (local_90.ptr != (UResourceBundle *)0x0) {
                ures_close_63(local_90.ptr);
              }
              local_90.ptr = pUVar10;
              if (U_ZERO_ERROR < local_c0) break;
              pcVar19 = ures_getKey_63(pUVar10);
              local_ac = 0;
              pUVar11 = ures_getString_63(local_90.ptr,(int32_t *)&local_ac,&local_c0);
              cVar20 = '\x03';
              if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
                cs = pcVar19;
                if (0 < (int)local_ac) {
                  cs = (char *)uprv_malloc_63((ulong)local_ac + 1);
                  if (cs == (char *)0x0) {
                    local_c0 = U_MEMORY_ALLOCATION_ERROR;
                    cVar20 = '\x03';
                    bVar1 = false;
                    cs = pcVar19;
                  }
                  else {
                    u_UCharsToChars_63(pUVar11,cs,local_ac);
                    cs[(int)local_ac] = '\0';
                    icu_63::UVector::addElement(gKeyTypeStringPool,cs,&local_c0);
                    bVar1 = local_c0 < U_ILLEGAL_ARGUMENT_ERROR;
                    if (U_ZERO_ERROR < local_c0) {
                      cs = pcVar19;
                    }
                    cVar20 = (U_ZERO_ERROR < local_c0) * '\x03';
                  }
                  if (!bVar1) goto LAB_001bd0bf;
                }
                iVar5 = strcmp(pcVar19,"timezone");
                local_80 = uhash_open_63(uhash_hashIChars_63,uhash_compareIChars_63,
                                         (undefined1 *)0x0,&local_c0);
                cVar20 = '\x03';
                if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
                  local_98.ptr = (UResourceBundle *)0x0;
                  local_a0.ptr = (UResourceBundle *)0x0;
                  if (local_40.super_LocalPointerBase<UResourceBundle>.ptr != (UResourceBundle *)0x0
                     ) {
                    local_bc = U_ZERO_ERROR;
                    pUVar10 = ures_getByKey_63((UResourceBundle *)
                                               local_40.super_LocalPointerBase<UResourceBundle>.ptr,
                                               pcVar19,(UResourceBundle *)0x0,&local_bc);
                    if (local_98.ptr != (UResourceBundle *)0x0) {
                      ures_close_63(local_98.ptr);
                    }
                    local_98.ptr = pUVar10;
                    if (U_ZERO_ERROR < local_bc) {
                      local_98.ptr = (UResourceBundle *)0x0;
                    }
                  }
                  if (local_48.ptr != (UResourceBundle *)0x0) {
                    local_bc = U_ZERO_ERROR;
                    pUVar10 = ures_getByKey_63(local_48.ptr,cs,(UResourceBundle *)0x0,&local_bc);
                    if (local_a0.ptr != (UResourceBundle *)0x0) {
                      ures_close_63(local_a0.ptr);
                    }
                    local_a0.ptr = pUVar10;
                    if (U_ZERO_ERROR < local_bc) {
                      local_a0.ptr = (UResourceBundle *)0x0;
                    }
                  }
                  local_bc = U_ZERO_ERROR;
                  local_58.ptr = ures_getByKey_63(local_38.ptr,pcVar19,(UResourceBundle *)0x0,
                                                  &local_bc);
                  uVar21 = 0;
                  if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
                    local_a8.ptr = (UResourceBundle *)0x0;
                    uVar21 = 0;
                    do {
                      UVar4 = ures_hasNext_63(local_58.ptr);
                      LVar3.ptr = local_a8.ptr;
                      if (UVar4 == '\0') break;
                      local_a8.ptr = (UResourceBundle *)0x0;
                      pUVar10 = ures_getNextResource_63(local_58.ptr,LVar3.ptr,&local_c0);
                      if (local_a8.ptr != (UResourceBundle *)0x0) {
                        ures_close_63(local_a8.ptr);
                      }
                      local_a8.ptr = pUVar10;
                      if (U_ZERO_ERROR < local_c0) break;
                      pcVar12 = ures_getKey_63(pUVar10);
                      iVar6 = strcmp(pcVar12,"CODEPOINTS");
                      if (iVar6 == 0) {
                        uVar21 = uVar21 | 1;
LAB_001bcc31:
                        cVar20 = '\x04';
                      }
                      else {
                        iVar6 = strcmp(pcVar12,"REORDER_CODE");
                        if (iVar6 == 0) {
                          uVar21 = uVar21 | 2;
                          goto LAB_001bcc31;
                        }
                        iVar6 = strcmp(pcVar12,"RG_KEY_VALUE");
                        if (iVar6 == 0) {
                          uVar21 = uVar21 | 4;
                          goto LAB_001bcc31;
                        }
                        local_6c = uVar21;
                        if ((iVar5 == 0) && (pcVar13 = strchr(pcVar12,0x3a), pcVar13 != (char *)0x0)
                           ) {
                          sVar15 = strlen(pcVar12);
                          pcVar13 = (char *)uprv_malloc_63((long)((int)sVar15 + 1));
                          if (pcVar13 == (char *)0x0) {
                            local_c0 = U_MEMORY_ALLOCATION_ERROR;
                            cVar20 = '\x05';
                          }
                          else {
                            lVar16 = 0;
                            while( true ) {
                              cVar20 = pcVar12[lVar16];
                              cVar18 = '/';
                              if ((cVar20 != ':') && (cVar18 = cVar20, cVar20 == '\0')) break;
                              pcVar13[lVar16] = cVar18;
                              lVar16 = lVar16 + 1;
                            }
                            pcVar13[lVar16] = '\0';
                            icu_63::UVector::addElement(gKeyTypeStringPool,pcVar13,&local_c0);
                            if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
                              pcVar12 = pcVar13;
                            }
                            cVar20 = (U_ZERO_ERROR < local_c0) * '\x05';
                          }
                          uVar21 = local_6c;
                          if (cVar20 == '\0') goto LAB_001bcbf4;
                        }
                        else {
LAB_001bcbf4:
                          local_b0 = 0;
                          pUVar11 = ures_getString_63(local_a8.ptr,(int32_t *)&local_b0,&local_c0);
                          if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
                            local_60 = pcVar12;
                            if (0 < (int)local_b0) {
                              local_88 = iVar5;
                              pcVar13 = (char *)uprv_malloc_63((ulong)local_b0 + 1);
                              if (pcVar13 == (char *)0x0) {
                                local_c0 = U_MEMORY_ALLOCATION_ERROR;
                                cVar20 = '\x05';
                                bVar1 = false;
                                local_60 = pcVar12;
                              }
                              else {
                                u_UCharsToChars_63(pUVar11,pcVar13,local_b0);
                                pcVar13[(int)local_b0] = '\0';
                                icu_63::UVector::addElement(gKeyTypeStringPool,pcVar13,&local_c0);
                                bVar1 = local_c0 < U_ILLEGAL_ARGUMENT_ERROR;
                                if (U_ZERO_ERROR < local_c0) {
                                  pcVar13 = pcVar12;
                                }
                                cVar20 = (U_ZERO_ERROR < local_c0) * '\x05';
                                local_60 = pcVar13;
                              }
                              iVar5 = local_88;
                              uVar21 = local_6c;
                              if (!bVar1) goto LAB_001bcc36;
                            }
                            puVar17 = (undefined8 *)uprv_malloc_63(0x10);
                            pcVar13 = local_60;
                            if (puVar17 == (undefined8 *)0x0) {
                              local_c0 = U_MEMORY_ALLOCATION_ERROR;
                            }
                            else {
                              puVar17[1] = local_60;
                              *puVar17 = pcVar12;
                              local_68 = puVar17;
                              icu_63::UVector::addElement(gLocExtTypeEntries,puVar17,&local_c0);
                              if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
                                uhash_put_63(local_80,pcVar12,local_68,&local_c0);
                                if (pcVar13 != pcVar12) {
                                  uhash_put_63(local_80,pcVar13,local_68,&local_c0);
                                }
                                cVar20 = '\x05';
                                uVar21 = local_6c;
                                if (U_ZERO_ERROR < local_c0) goto LAB_001bcc36;
                                if (local_98.ptr == (UResourceBundle *)0x0) {
LAB_001bcf93:
                                  if (local_a0.ptr != (UResourceBundle *)0x0) {
                                    local_b8.ptr = (UResourceBundle *)0x0;
                                    ures_resetIterator_63(local_a0.ptr);
                                    pcVar12 = local_60;
                                    while ((UVar4 = ures_hasNext_63(local_a0.ptr),
                                           LVar3.ptr = local_b8.ptr, UVar4 != '\0' &&
                                           (local_c0 < U_ILLEGAL_ARGUMENT_ERROR))) {
                                      local_b8.ptr = (UResourceBundle *)0x0;
                                      pUVar10 = ures_getNextResource_63
                                                          (local_a0.ptr,LVar3.ptr,&local_c0);
                                      if (local_b8.ptr != (UResourceBundle *)0x0) {
                                        ures_close_63(local_b8.ptr);
                                      }
                                      local_b8.ptr = pUVar10;
                                      pUVar11 = ures_getString_63(pUVar10,&local_84,&local_c0);
                                      if (U_ZERO_ERROR < local_c0) break;
                                      iVar7 = uprv_compareInvAscii_63
                                                        ((UDataSwapper *)0x0,pcVar12,-1,pUVar11,
                                                         local_84);
                                      if (iVar7 == 0) {
                                        pcVar13 = ures_getKey_63(local_b8.ptr);
                                        uhash_put_63(local_80,pcVar13,local_68,&local_c0);
                                      }
                                    }
                                    UVar2 = local_c0;
                                    icu_63::LocalUResourceBundlePointer::
                                    ~LocalUResourceBundlePointer
                                              ((LocalUResourceBundlePointer *)&local_b8);
                                    if (U_ZERO_ERROR < UVar2) goto LAB_001bd076;
                                  }
                                  cVar20 = '\0';
                                  uVar21 = local_6c;
                                }
                                else {
                                  local_b8.ptr = (UResourceBundle *)0x0;
                                  ures_resetIterator_63(local_98.ptr);
                                  local_88 = iVar5;
                                  while ((UVar4 = ures_hasNext_63(local_98.ptr),
                                         LVar3.ptr = local_b8.ptr, UVar4 != '\0' &&
                                         (local_c0 < U_ILLEGAL_ARGUMENT_ERROR))) {
                                    local_b8.ptr = (UResourceBundle *)0x0;
                                    pUVar10 = ures_getNextResource_63
                                                        (local_98.ptr,LVar3.ptr,&local_c0);
                                    if (local_b8.ptr != (UResourceBundle *)0x0) {
                                      ures_close_63(local_b8.ptr);
                                    }
                                    local_b8.ptr = pUVar10;
                                    pUVar11 = ures_getString_63(pUVar10,&local_84,&local_c0);
                                    if (U_ZERO_ERROR < local_c0) break;
                                    iVar7 = uprv_compareInvAscii_63
                                                      ((UDataSwapper *)0x0,pcVar12,-1,pUVar11,
                                                       local_84);
                                    if (iVar7 == 0) {
                                      pcVar13 = ures_getKey_63(local_b8.ptr);
                                      if ((iVar5 == 0) &&
                                         (pcVar14 = strchr(pcVar13,0x3a), pcVar14 != (char *)0x0)) {
                                        sVar15 = strlen(pcVar13);
                                        pcVar14 = (char *)uprv_malloc_63((long)((sVar15 << 0x20) +
                                                                               0x100000000) >> 0x20)
                                        ;
                                        if (pcVar14 == (char *)0x0) {
                                          local_c0 = U_MEMORY_ALLOCATION_ERROR;
                                          bVar1 = false;
                                        }
                                        else {
                                          lVar16 = 0;
                                          while( true ) {
                                            cVar20 = pcVar13[lVar16];
                                            cVar18 = '/';
                                            if ((cVar20 != ':') && (cVar18 = cVar20, cVar20 == '\0')
                                               ) break;
                                            pcVar14[lVar16] = cVar18;
                                            lVar16 = lVar16 + 1;
                                          }
                                          pcVar14[lVar16] = '\0';
                                          icu_63::UVector::addElement
                                                    (gKeyTypeStringPool,pcVar14,&local_c0);
                                          bVar1 = local_c0 < U_ILLEGAL_ARGUMENT_ERROR;
                                          if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
                                            pcVar13 = pcVar14;
                                          }
                                        }
                                        iVar5 = local_88;
                                        if (!bVar1) break;
                                      }
                                      uhash_put_63(local_80,pcVar13,local_68,&local_c0);
                                    }
                                  }
                                  UVar2 = local_c0;
                                  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                                            ((LocalUResourceBundlePointer *)&local_b8);
                                  if (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_001bcf93;
LAB_001bd076:
                                  cVar20 = (U_ZERO_ERROR < UVar2) * '\x05';
                                  uVar21 = local_6c;
                                }
                                goto LAB_001bcc36;
                              }
                            }
                          }
                          cVar20 = '\x05';
                          uVar21 = local_6c;
                        }
                      }
LAB_001bcc36:
                    } while (cVar20 != '\x05');
                    icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                              ((LocalUResourceBundlePointer *)&local_a8);
                  }
                  cVar20 = '\x03';
                  if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
                    puVar17 = (undefined8 *)uprv_malloc_63(0x20);
                    if (puVar17 == (undefined8 *)0x0) {
                      local_c0 = U_MEMORY_ALLOCATION_ERROR;
                    }
                    else {
                      puVar17[1] = cs;
                      *puVar17 = pcVar19;
                      *(uint *)(puVar17 + 3) = uVar21;
                      puVar17[2] = local_80;
                      icu_63::UVector::addElement(gLocExtKeyDataEntries,puVar17,&local_c0);
                      if (local_c0 < U_ILLEGAL_ARGUMENT_ERROR) {
                        uhash_put_63(gLocExtKeyMap,pcVar19,puVar17,&local_c0);
                        if (pcVar19 != cs) {
                          uhash_put_63(gLocExtKeyMap,cs,puVar17,&local_c0);
                        }
                        cVar20 = (U_ZERO_ERROR < local_c0) * '\x03';
                      }
                    }
                  }
                  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                            ((LocalUResourceBundlePointer *)&local_58);
                  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                            ((LocalUResourceBundlePointer *)&local_a0);
                  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                            ((LocalUResourceBundlePointer *)&local_98);
                }
              }
LAB_001bd0bf:
            } while (cVar20 == '\0');
            icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                      ((LocalUResourceBundlePointer *)&local_90);
          }
        }
      }
      icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&local_48);
      icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_40);
    }
    icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_38);
    icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_50);
    icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_78);
    gLocExtKeyMapInitOnce.fErrCode = local_c0;
    icu_63::umtx_initImplPostInit(&gLocExtKeyMapInitOnce);
    uVar9 = extraout_RAX;
  }
  return (int)CONCAT71((int7)(uVar9 >> 8),local_c0 < U_ILLEGAL_ARGUMENT_ERROR);
}

Assistant:

static UBool
init() {
    UErrorCode sts = U_ZERO_ERROR;
    umtx_initOnce(gLocExtKeyMapInitOnce, &initFromResourceBundle, sts);
    if (U_FAILURE(sts)) {
        return FALSE;
    }
    return TRUE;
}